

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

json_t * json_object_deep_copy(json_t *object)

{
  char *key_00;
  json_t *pjVar1;
  json_t *value;
  char *key;
  void *iter;
  json_t *result;
  json_t *object_local;
  
  object_local = json_object();
  if (object_local == (json_t *)0x0) {
    object_local = (json_t *)0x0;
  }
  else {
    for (key = (char *)json_object_iter(object); key != (char *)0x0;
        key = (char *)json_object_iter_next(object,key)) {
      key_00 = json_object_iter_key(key);
      pjVar1 = json_object_iter_value(key);
      pjVar1 = json_deep_copy(pjVar1);
      json_object_set_new_nocheck(object_local,key_00,pjVar1);
    }
  }
  return object_local;
}

Assistant:

static json_t *json_object_deep_copy(const json_t *object)
{
	json_t *result;
	void *iter;

	result = json_object();
	if (!result)
		return NULL;

	/* Cannot use json_object_foreach because object has to be cast
	   non-const */
	iter = json_object_iter((json_t *)object);
	while (iter) {
		const char *key;
		const json_t *value;
		key = json_object_iter_key(iter);
		value = json_object_iter_value(iter);

		json_object_set_new_nocheck(result, key, json_deep_copy(value));
		iter = json_object_iter_next((json_t *)object, iter);
	}

	return result;
}